

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::anon_unknown_1::TextureFragmentShader::shadeFragments
          (TextureFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int x;
  int iVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  Vec4 texColor3;
  Vec4 texColor2;
  Vec4 texColor1;
  Vec4 texColor0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [20];
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ConstPixelBufferAccess local_58;
  
  if (0 < numPackets) {
    x = (int)this + 0x38;
    lVar6 = 0;
    do {
      iVar4 = (packets->position).m_data[0];
      iVar7 = (packets->position).m_data[1];
      iVar2 = iVar7 * iVar4;
      iVar3 = (this->m_texture).m_size.m_data[0] + -1;
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      if (iVar2 < 0) {
        iVar3 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_58.m_size.m_data + 2),x,iVar3,0);
      iVar2 = iVar7 * (iVar4 + 1);
      iVar3 = (this->m_texture).m_size.m_data[0] + -1;
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      if (iVar2 < 0) {
        iVar3 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel(&local_58,x,iVar3,0);
      iVar2 = iVar4 * (iVar7 + 1);
      iVar3 = (this->m_texture).m_size.m_data[0] + -1;
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      if (iVar2 < 0) {
        iVar3 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)(local_78 + 0x10),x,iVar3,0);
      iVar7 = (iVar7 + 1) * (iVar4 + 1);
      iVar4 = (this->m_texture).m_size.m_data[0] + -1;
      if (iVar7 < iVar4) {
        iVar4 = iVar7;
      }
      if (iVar7 < 0) {
        iVar4 = 0;
      }
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_78,x,iVar4,0);
      rr::readVarying<float>((rr *)&local_88,packets,context,0,0);
      rr::readVarying<float>((rr *)&local_98,packets,context,0,1);
      rr::readVarying<float>((rr *)&local_a8,packets,context,0,2);
      rr::readVarying<float>((rr *)&local_b8,packets,context,0,3);
      fVar9 = (fStack_7c + (float)local_58.m_pitch.m_data[2]) * 0.5;
      pGVar1 = context->outputArray;
      iVar4 = context->numFragmentOutputs;
      iVar7 = (int)lVar6;
      iVar3 = (iVar7 + 1) * iVar4;
      iVar2 = (iVar7 + 2) * iVar4;
      iVar5 = (iVar7 + 3) * iVar4;
      iVar4 = iVar4 * iVar7;
      *(ulong *)&pGVar1[iVar4].v =
           CONCAT44((fStack_84 + (float)local_58.m_pitch.m_data[0]) * 0.5 * fVar9,
                    fVar9 * (local_88 + (float)local_58.m_size.m_data[2]) * 0.5);
      pGVar1[iVar4].v.fData[2] = (fStack_80 + (float)local_58.m_pitch.m_data[1]) * 0.5 * fVar9;
      pGVar1[iVar4].v.uData[3] = 0x3f800000;
      fVar9 = (fStack_8c + (float)local_58.m_size.m_data[1]) * 0.5;
      *(ulong *)&pGVar1[iVar3].v =
           CONCAT44((fStack_94 + (float)local_58.m_format.type) * 0.5 * fVar9,
                    fVar9 * (local_98 + (float)local_58.m_format.order) * 0.5);
      pGVar1[iVar3].v.fData[2] = (fStack_90 + (float)local_58.m_size.m_data[0]) * 0.5 * fVar9;
      pGVar1[iVar3].v.uData[3] = 0x3f800000;
      fVar8 = (fStack_9c + fStack_5c) * 0.5;
      fVar9 = (fStack_ac + (float)local_78._12_4_) * 0.5;
      *(ulong *)&pGVar1[iVar2].v =
           CONCAT44((fStack_a4 + fStack_64) * 0.5 * fVar8,
                    fVar8 * (local_a8 + (float)local_78._16_4_) * 0.5);
      pGVar1[iVar2].v.fData[2] = (fStack_a0 + fStack_60) * 0.5 * fVar8;
      pGVar1[iVar2].v.uData[3] = 0x3f800000;
      *(ulong *)&pGVar1[iVar5].v =
           CONCAT44((fStack_b4 + (float)local_78._4_4_) * 0.5 * fVar9,
                    fVar9 * (local_b8 + (float)local_78._0_4_) * 0.5);
      pGVar1[iVar5].v.fData[2] = (fStack_b0 + (float)local_78._8_4_) * 0.5 * fVar9;
      pGVar1[iVar5].v.uData[3] = 0x3f800000;
      packets = packets + 1;
      lVar6 = lVar6 + 4;
    } while ((ulong)(uint)numPackets << 2 != lVar6);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::IVec2	position0	= packet.position + tcu::IVec2(0, 0);
			const tcu::IVec2	position1	= packet.position + tcu::IVec2(1, 0);
			const tcu::IVec2	position2	= packet.position + tcu::IVec2(0, 1);
			const tcu::IVec2	position3	= packet.position + tcu::IVec2(1, 1);

			const tcu::Vec4		texColor0	= m_texture.getPixel(de::clamp((position0.x() * position0.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor1	= m_texture.getPixel(de::clamp((position1.x() * position1.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor2	= m_texture.getPixel(de::clamp((position2.x() * position2.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor3	= m_texture.getPixel(de::clamp((position3.x() * position3.y()), 0, m_texture.getWidth()-1), 0);

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= 0.5f * (vtxColor0 + texColor0);
			const tcu::Vec4		color1		= 0.5f * (vtxColor1 + texColor1);
			const tcu::Vec4		color2		= 0.5f * (vtxColor2 + texColor2);
			const tcu::Vec4		color3		= 0.5f * (vtxColor3 + texColor3);

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}